

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_construct(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bitset_t *pbVar7;
  short sVar8;
  long lVar9;
  long lVar10;
  bitset_t *pbVar11;
  long lVar12;
  ulong uVar13;
  short sVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong auStack_1c8 [5];
  bitset_t *pbStack_1a0;
  bitset_t *pbStack_198;
  code *pcStack_190;
  bitset_t *pbStack_180;
  undefined8 uStack_178;
  bitset_t *pbStack_170;
  code *pcStack_168;
  bitset_t *pbStack_158;
  bitset_t *pbStack_150;
  bitset_t *pbStack_148;
  ulong uStack_140;
  ulong uStack_138;
  bitset_t *pbStack_130;
  code *pcStack_128;
  bitset_t *pbStack_120;
  long lStack_118;
  ulong uStack_110;
  bitset_t *pbStack_108;
  code *pcStack_100;
  bitset_t *pbStack_f0;
  ulong uStack_e8;
  ulong uStack_e0;
  bitset_t *pbStack_d8;
  long lStack_d0;
  code *pcStack_c8;
  size_t sStack_c0;
  long lStack_b8;
  long lStack_b0;
  bitset_t *pbStack_a8;
  code *pcStack_a0;
  size_t sStack_98;
  bitset_t *pbStack_90;
  ulong uStack_88;
  
  uVar19 = 0;
  pbVar3 = bitset_create();
  do {
    uVar21 = uVar19 >> 6;
    if ((uVar21 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar21 + 1), _Var2)) {
      pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)uVar19 & 0x3f);
    }
    uVar19 = uVar19 + 3;
  } while (uVar19 != 3000);
  sVar4 = bitset_count(pbVar3);
  if (sVar4 == 1000) {
    sVar8 = 0;
    uVar19 = 0;
    do {
      sVar14 = (short)(((uint)uVar19 & 0xffff) / 3) * 3 + sVar8;
      if (uVar19 >> 6 < pbVar3->arraysize) {
        if ((sVar14 != 0) == ((pbVar3->array[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) {
LAB_00101b79:
          test_construct_cold_2();
          break;
        }
      }
      else if (sVar14 == 0) goto LAB_00101b79;
      uVar19 = uVar19 + 1;
      sVar8 = sVar8 + -1;
      if (uVar19 == 3000) {
        bitset_free(pbVar3);
        return;
      }
    } while( true );
  }
  test_construct_cold_1();
  uVar19 = 300;
  pbVar3 = bitset_create();
  while( true ) {
    uVar21 = uVar19 >> 6;
    if ((uVar21 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar21 + 1), _Var2)) {
      pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)uVar19 & 0x3f);
    }
    sVar4 = bitset_minimum(pbVar3);
    if (sVar4 != 300) break;
    sVar4 = bitset_maximum(pbVar3);
    if (uVar19 != sVar4) {
      test_max_min_cold_2();
      break;
    }
    uVar19 = uVar19 + 3;
    if (uVar19 == 3000) {
      bitset_free(pbVar3);
      return;
    }
  }
  test_max_min_cold_1();
  sVar4 = 0;
  while( true ) {
    uVar19 = 300;
    pbVar3 = bitset_create();
    do {
      uVar21 = uVar19 >> 6;
      if ((uVar21 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar21 + 1), _Var2)) {
        pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)uVar19 & 0x3f);
      }
      uVar19 = uVar19 + 3;
    } while (uVar19 != 15000);
    sVar5 = bitset_count(pbVar3);
    bitset_shift_left(pbVar3,sVar4);
    sVar6 = bitset_count(pbVar3);
    if (sVar6 != sVar5) break;
    lVar9 = 300;
    do {
      uVar19 = sVar4 + lVar9 >> 6;
      if ((pbVar3->arraysize <= uVar19) ||
         ((pbVar3->array[uVar19] >> (sVar4 + lVar9 & 0x3f) & 1) == 0)) {
        test_shift_left_cold_2();
        goto LAB_00101cd8;
      }
      lVar9 = lVar9 + 3;
    } while (lVar9 != 15000);
    bitset_free(pbVar3);
    sVar4 = sVar4 + 1;
    if (sVar4 == 0x100) {
      return;
    }
  }
LAB_00101cd8:
  test_shift_left_cold_1();
  pbVar3 = bitset_create();
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array | 2;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array & 0xfffffffffffffffd;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array & 0xfffffffffffffbff;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array | 0x400;
  }
  if ((pbVar3->arraysize == 0) || (((uint)*pbVar3->array >> 10 & 1) == 0)) {
    test_set_to_val_cold_2();
  }
  else if ((*pbVar3->array & 2) == 0) {
    bitset_free(pbVar3);
    return;
  }
  test_set_to_val_cold_1();
  lVar9 = 0;
  lVar18 = 0;
  sStack_98 = 0;
  pbStack_90 = pbVar3;
  uStack_88 = uVar21;
  do {
    lVar12 = 300;
    pcStack_a0 = (code *)0x101db3;
    pbVar3 = bitset_create();
    do {
      uVar19 = (ulong)(lVar18 + lVar12) >> 6;
      if (uVar19 < pbVar3->arraysize) {
LAB_00101dd9:
        pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)(lVar18 + lVar12) & 0x3f);
      }
      else {
        pcStack_a0 = (code *)0x101dd5;
        _Var2 = bitset_grow(pbVar3,uVar19 + 1);
        if (_Var2) goto LAB_00101dd9;
      }
      lVar12 = lVar12 + 3;
    } while (lVar12 != 0x3bc4);
    pcStack_a0 = (code *)0x101dff;
    sVar5 = bitset_count(pbVar3);
    sVar4 = sStack_98;
    pcStack_a0 = (code *)0x101e11;
    bitset_shift_right(pbVar3,sStack_98);
    pcStack_a0 = (code *)0x101e19;
    sVar6 = bitset_count(pbVar3);
    if (sVar6 != sVar5) {
LAB_00101e85:
      pcStack_a0 = test_union_intersection;
      test_shift_right_cold_1();
      sStack_c0 = sVar4;
      pcStack_c8 = (code *)0x101e98;
      lStack_b8 = lVar9;
      lStack_b0 = lVar18;
      pbStack_a8 = pbVar3;
      pcStack_a0 = (code *)sVar5;
      pbVar3 = bitset_create();
      lVar9 = 0;
      pcStack_c8 = (code *)0x101ea3;
      pbVar7 = bitset_create();
      uVar19 = 0;
      break;
    }
    lVar10 = 300;
    do {
      uVar19 = (ulong)(lVar9 + lVar10) >> 6;
      if ((pbVar3->arraysize <= uVar19) ||
         ((pbVar3->array[uVar19] >> (lVar9 + lVar10 & 0x3fU) & 1) == 0)) {
        pcStack_a0 = (code *)0x101e85;
        test_shift_right_cold_2();
        goto LAB_00101e85;
      }
      lVar10 = lVar10 + 3;
    } while (lVar10 != 0x3bc4);
    pcStack_a0 = (code *)0x101e59;
    bitset_free(pbVar3);
    sStack_98 = sVar4 + 1;
    lVar18 = lVar18 + 3;
    lVar9 = lVar9 + 2;
    if (sStack_98 == 0x100) {
      return;
    }
  } while( true );
  while( true ) {
    uVar19 = uVar19 + 1;
    lVar9 = lVar9 + 2;
    if (uVar19 == 1000) break;
    uVar21 = uVar19 >> 5;
    if (uVar21 < pbVar3->arraysize) {
LAB_00101ec6:
      pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)lVar9 & 0x3e);
    }
    else {
      pcStack_c8 = (code *)0x101ec2;
      _Var2 = bitset_grow(pbVar3,uVar21 + 1);
      if (_Var2) goto LAB_00101ec6;
    }
    if (uVar21 < pbVar7->arraysize) {
LAB_00101ef1:
      pbVar7->array[uVar21] = pbVar7->array[uVar21] | 2L << ((byte)lVar9 & 0x3e);
    }
    else {
      pcStack_c8 = (code *)0x101eed;
      _Var2 = bitset_grow(pbVar7,uVar21 + 1);
      if (_Var2) goto LAB_00101ef1;
    }
  }
  pcStack_c8 = (code *)0x101f21;
  bitset_inplace_symmetric_difference(pbVar3,pbVar7);
  pcStack_c8 = (code *)0x101f29;
  sVar4 = bitset_count(pbVar3);
  if (sVar4 == 2000) {
    pcStack_c8 = (code *)0x101f40;
    bitset_inplace_symmetric_difference(pbVar3,pbVar7);
    pcStack_c8 = (code *)0x101f48;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102002;
    pcStack_c8 = (code *)0x101f5f;
    bitset_inplace_difference(pbVar3,pbVar7);
    pcStack_c8 = (code *)0x101f67;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102007;
    pcStack_c8 = (code *)0x101f7e;
    bitset_inplace_union(pbVar3,pbVar7);
    pcStack_c8 = (code *)0x101f86;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 2000) goto LAB_0010200c;
    pcStack_c8 = (code *)0x101f99;
    bitset_inplace_intersection(pbVar3,pbVar7);
    pcStack_c8 = (code *)0x101fa1;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102011;
    pcStack_c8 = (code *)0x101fb4;
    bitset_inplace_difference(pbVar3,pbVar7);
    pcStack_c8 = (code *)0x101fbc;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 0) goto LAB_00102016;
    pcStack_c8 = (code *)0x101fcc;
    bitset_inplace_union(pbVar3,pbVar7);
    pcStack_c8 = (code *)0x101fd7;
    bitset_inplace_difference(pbVar7,pbVar3);
    pcStack_c8 = (code *)0x101fdf;
    sVar4 = bitset_count(pbVar7);
    if (sVar4 == 0) {
      pcStack_c8 = (code *)0x101fec;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_c8 = (code *)0x102002;
    test_union_intersection_cold_1();
LAB_00102002:
    pcStack_c8 = (code *)0x102007;
    test_union_intersection_cold_2();
LAB_00102007:
    pcStack_c8 = (code *)0x10200c;
    test_union_intersection_cold_3();
LAB_0010200c:
    pcStack_c8 = (code *)0x102011;
    test_union_intersection_cold_4();
LAB_00102011:
    pcStack_c8 = (code *)0x102016;
    test_union_intersection_cold_5();
LAB_00102016:
    pcStack_c8 = (code *)0x10201b;
    test_union_intersection_cold_6();
  }
  pcStack_c8 = test_counts;
  test_union_intersection_cold_7();
  pcStack_100 = (code *)0x102030;
  pbStack_f0 = pbVar3;
  uStack_e8 = uVar19;
  uStack_e0 = uVar21;
  pbStack_d8 = pbVar7;
  lStack_d0 = lVar9;
  pcStack_c8 = (code *)lVar12;
  pbVar3 = bitset_create();
  lVar9 = 0;
  pcStack_100 = (code *)0x10203b;
  pbVar7 = bitset_create();
  uVar21 = 0;
  uVar19 = 0;
  do {
    uVar13 = uVar19 >> 5;
    if (uVar13 < pbVar3->arraysize) {
LAB_00102061:
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)lVar9 & 0x3e);
    }
    else {
      pcStack_100 = (code *)0x10205d;
      _Var2 = bitset_grow(pbVar3,uVar13 + 1);
      if (_Var2) goto LAB_00102061;
    }
    uVar13 = uVar21 >> 6;
    if (uVar13 < pbVar7->arraysize) {
LAB_00102093:
      pbVar7->array[uVar13] = pbVar7->array[uVar13] | 1L << ((byte)uVar21 & 0x3f);
    }
    else {
      pcStack_100 = (code *)0x10208f;
      _Var2 = bitset_grow(pbVar7,uVar13 + 1);
      if (_Var2) goto LAB_00102093;
    }
    uVar19 = uVar19 + 1;
    uVar21 = uVar21 + 3;
    lVar9 = lVar9 + 2;
  } while (uVar19 != 1000);
  pcStack_100 = (code *)0x1020c4;
  sVar4 = bitset_intersection_count(pbVar3,pbVar7);
  if (sVar4 == 0x14e) {
    pcStack_100 = (code *)0x1020d7;
    sVar4 = bitset_union_count(pbVar3,pbVar7);
    if (sVar4 == 0x682) {
      pcStack_100 = (code *)0x1020e7;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_100 = (code *)0x102102;
    test_counts_cold_1();
  }
  pcStack_100 = test_disjoint;
  test_counts_cold_2();
  pcStack_128 = (code *)0x102115;
  pbStack_120 = pbVar3;
  lStack_118 = lVar9;
  uStack_110 = uVar19;
  pbStack_108 = pbVar7;
  pcStack_100 = (code *)uVar21;
  pbVar3 = bitset_create();
  uVar19 = 0;
  pcStack_128 = (code *)0x102120;
  pbVar7 = bitset_create();
  do {
    uVar21 = uVar19 >> 6;
    if ((uVar19 & 1) == 0) {
      uVar13 = 0x3e;
      pbVar11 = pbVar3;
      if (uVar21 < pbVar3->arraysize) goto LAB_00102176;
      pcStack_128 = (code *)0x10215e;
      _Var2 = bitset_grow(pbVar3,uVar21 + 1);
LAB_00102172:
      if (_Var2 != false) goto LAB_00102176;
    }
    else {
      uVar13 = 0x3f;
      pbVar11 = pbVar7;
      if (pbVar7->arraysize <= uVar21) {
        pcStack_128 = (code *)0x10216f;
        _Var2 = bitset_grow(pbVar7,uVar21 + 1);
        goto LAB_00102172;
      }
LAB_00102176:
      uVar20 = (uint)uVar13 & (uint)uVar19;
      uVar13 = (ulong)uVar20;
      pbVar11->array[uVar21] = pbVar11->array[uVar21] | 1L << (sbyte)uVar20;
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 1000);
  pcStack_128 = (code *)0x1021a2;
  _Var2 = bitsets_disjoint(pbVar3,pbVar7);
  if (_Var2) {
    uVar13 = 0x20000000000000;
    if (pbVar3->arraysize < 8) {
      pcStack_128 = (code *)0x1021c4;
      _Var2 = bitset_grow(pbVar3,8);
      if (_Var2) goto LAB_001021c8;
    }
    else {
LAB_001021c8:
      pbVar3->array[7] = pbVar3->array[7] | 0x20000000000000;
    }
    if (pbVar7->arraysize < 8) {
      pcStack_128 = (code *)0x1021e3;
      _Var2 = bitset_grow(pbVar7,8);
      if (_Var2) goto LAB_001021e7;
    }
    else {
LAB_001021e7:
      pbVar7->array[7] = pbVar7->array[7] | 0x20000000000000;
    }
    pcStack_128 = (code *)0x1021f9;
    _Var2 = bitsets_disjoint(pbVar3,pbVar7);
    if (!_Var2) {
      pcStack_128 = (code *)0x102205;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_128 = (code *)0x10221b;
    test_disjoint_cold_1();
  }
  pcStack_128 = test_intersects;
  test_disjoint_cold_2();
  pbStack_150 = (bitset_t *)0x10222e;
  pbStack_148 = pbVar3;
  uStack_140 = uVar19;
  uStack_138 = uVar21;
  pbStack_130 = pbVar7;
  pcStack_128 = (code *)uVar13;
  pbVar3 = bitset_create();
  pbStack_150 = (bitset_t *)0x102236;
  pbVar7 = bitset_create();
  pbStack_150 = (bitset_t *)0x102241;
  _Var2 = bitset_empty(pbVar3);
  if (_Var2) {
    uVar19 = 0;
    do {
      uVar21 = uVar19 >> 6;
      if ((uVar19 & 1) == 0) {
        uVar13 = 0x3e;
        pbVar11 = pbVar3;
        if (uVar21 < pbVar3->arraysize) goto LAB_0010229f;
        pbStack_150 = (bitset_t *)0x102287;
        _Var2 = bitset_grow(pbVar3,uVar21 + 1);
LAB_0010229b:
        if (_Var2 != false) goto LAB_0010229f;
      }
      else {
        uVar13 = 0x3f;
        pbVar11 = pbVar7;
        if (pbVar7->arraysize <= uVar21) {
          pbStack_150 = (bitset_t *)0x102298;
          _Var2 = bitset_grow(pbVar7,uVar21 + 1);
          goto LAB_0010229b;
        }
LAB_0010229f:
        uVar20 = (uint)uVar13 & (uint)uVar19;
        uVar13 = (ulong)uVar20;
        pbVar11->array[uVar21] = pbVar11->array[uVar21] | 1L << (sbyte)uVar20;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != 1000);
    pbStack_150 = (bitset_t *)0x1022cb;
    _Var2 = bitsets_intersect(pbVar3,pbVar7);
    if (_Var2) goto LAB_00102344;
    uVar13 = 0x20000000000;
    if (pbVar3->arraysize < 0x10) {
      pbStack_150 = (bitset_t *)0x1022ed;
      _Var2 = bitset_grow(pbVar3,0x10);
      if (_Var2) goto LAB_001022f1;
    }
    else {
LAB_001022f1:
      pbVar3->array[0xf] = pbVar3->array[0xf] | 0x20000000000;
    }
    if (pbVar7->arraysize < 0x10) {
      pbStack_150 = (bitset_t *)0x10230c;
      _Var2 = bitset_grow(pbVar7,0x10);
      if (_Var2) goto LAB_00102310;
    }
    else {
LAB_00102310:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pbStack_150 = (bitset_t *)0x102322;
    _Var2 = bitsets_intersect(pbVar3,pbVar7);
    if (_Var2) {
      pbStack_150 = (bitset_t *)0x10232e;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pbStack_150 = (bitset_t *)0x102344;
    test_intersects_cold_1();
LAB_00102344:
    pbStack_150 = (bitset_t *)0x102349;
    test_intersects_cold_3();
  }
  pbStack_150 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_168 = (code *)0x10235c;
  pbStack_158 = pbVar3;
  pbStack_150 = pbVar7;
  pbVar3 = bitset_create_with_capacity(10);
  pcStack_168 = (code *)0x102369;
  pbVar7 = bitset_create_with_capacity(5);
  if (pbVar3->arraysize == 0) {
    pcStack_168 = (code *)0x102380;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_00102384;
  }
  else {
LAB_00102384:
    *pbVar3->array = *pbVar3->array | 2;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_168 = (code *)0x10239f;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023a3;
  }
  else {
LAB_001023a3:
    *pbVar3->array = *pbVar3->array | 0x10;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_168 = (code *)0x1023be;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023c2;
  }
  else {
LAB_001023c2:
    *pbVar3->array = *pbVar3->array | 0x40;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_168 = (code *)0x1023dd;
    _Var2 = bitset_grow(pbVar7,1);
    if (_Var2) goto LAB_001023e1;
  }
  else {
LAB_001023e1:
    *pbVar7->array = *pbVar7->array | 2;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_168 = (code *)0x1023fc;
    _Var2 = bitset_grow(pbVar7,1);
    if (_Var2) goto LAB_00102400;
  }
  else {
LAB_00102400:
    *pbVar7->array = *pbVar7->array | 0x10;
  }
  pcStack_168 = (code *)0x102412;
  _Var2 = bitset_contains_all(pbVar3,pbVar7);
  if (_Var2) {
    pcStack_168 = (code *)0x102421;
    _Var2 = bitset_contains_all(pbVar7,pbVar3);
    if (!_Var2) {
      pcStack_168 = (code *)0x10242d;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_168 = (code *)0x102441;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_168 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_190 = (code *)0x102453;
  pbStack_180 = pbVar3;
  uStack_178 = 1000;
  pbStack_170 = pbVar7;
  pcStack_168 = (code *)uVar13;
  pbVar3 = bitset_create();
  uVar19 = 0;
  pcStack_190 = (code *)0x10245e;
  pbVar7 = bitset_create();
  do {
    uVar21 = uVar19 >> 6;
    if (uVar21 < pbVar3->arraysize) {
LAB_0010247f:
      pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)uVar19 & 0x3f);
    }
    else {
      pcStack_190 = (code *)0x10247b;
      _Var2 = bitset_grow(pbVar3,uVar21 + 1);
      if (_Var2) goto LAB_0010247f;
    }
    if ((uVar19 & 1) == 0) {
      if (pbVar7->arraysize <= uVar21) {
        pcStack_190 = (code *)0x1024aa;
        _Var2 = bitset_grow(pbVar7,uVar21 + 1);
        if (!_Var2) goto LAB_001024c3;
      }
      pbVar7->array[uVar21] = pbVar7->array[uVar21] | 1L << ((byte)uVar19 & 0x3e);
    }
LAB_001024c3:
    uVar19 = uVar19 + 1;
  } while (uVar19 != 1000);
  pcStack_190 = (code *)0x1024da;
  _Var2 = bitset_contains_all(pbVar3,pbVar7);
  if (_Var2) {
    pcStack_190 = (code *)0x1024e9;
    _Var2 = bitset_contains_all(pbVar7,pbVar3);
    if (_Var2) goto LAB_00102554;
    if (pbVar7->arraysize < 0x10) {
      pcStack_190 = (code *)0x102501;
      _Var2 = bitset_grow(pbVar7,0x10);
      if (_Var2) goto LAB_00102505;
    }
    else {
LAB_00102505:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pcStack_190 = (code *)0x102521;
    _Var2 = bitset_contains_all(pbVar3,pbVar7);
    if (!_Var2) {
      pcStack_190 = (code *)0x102530;
      _Var2 = bitset_contains_all(pbVar7,pbVar3);
      if (!_Var2) {
        pcStack_190 = (code *)0x10253c;
        bitset_free(pbVar3);
        bitset_free(pbVar7);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_190 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_190 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_190 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_190 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar21 = 0;
  pbStack_1a0 = pbVar3;
  pbStack_198 = pbVar7;
  pcStack_190 = (code *)uVar19;
  pbVar3 = bitset_create();
  do {
    uVar19 = uVar21 >> 6;
    if (uVar19 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar21 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar19 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 100);
  uVar19 = 0x3e6;
  do {
    uVar19 = uVar19 + 2;
    uVar21 = uVar19 >> 6;
    if (uVar21 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)uVar19 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar21 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar19 < 0x44a);
  uVar19 = pbVar3->arraysize;
  if (uVar19 != 0) {
    puVar1 = pbVar3->array;
    uVar13 = 0;
    uVar21 = 0;
    lVar9 = 0;
    do {
      uVar17 = (puVar1[uVar13] >> ((byte)uVar21 & 0x3f)) << ((byte)uVar21 & 0x3f);
      uVar21 = uVar21 & 0xffffffffffffffc0;
      uVar15 = 0;
      do {
        while (uVar17 == 0) {
          uVar13 = uVar13 + 1;
          if (uVar13 == uVar19) {
            lVar18 = lVar9;
            if (uVar15 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar21 = uVar21 + 0x40;
          uVar17 = puVar1[uVar13];
          if (2 < uVar15) goto LAB_0010265a;
        }
        uVar16 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        auStack_1c8[uVar15 + 1] = uVar16 | uVar21;
        uVar15 = uVar15 + 1;
        uVar17 = uVar17 & uVar17 - 1;
      } while (uVar15 != 3);
      uVar15 = 3;
LAB_0010265a:
      lVar18 = lVar9 + uVar15;
      uVar21 = lVar9 * 2 + 800;
      uVar13 = 0;
      do {
        uVar16 = lVar9 + uVar13;
        if (99 < lVar9 + uVar13) {
          uVar16 = uVar21;
        }
        if (auStack_1c8[uVar13 + 1] != uVar16) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar13 = uVar13 + 1;
        uVar21 = uVar21 + 2;
      } while (uVar15 != uVar13);
      uVar21 = auStack_1c8[uVar15] + 1;
      uVar13 = uVar21 >> 6;
      lVar9 = lVar18;
    } while (uVar13 < uVar19);
LAB_001026ac:
    if (lVar18 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar19 = 0;
  pbVar3 = bitset_create();
  do {
    uVar21 = uVar19 >> 6;
    if ((uVar21 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar21 + 1), _Var2)) {
      pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)uVar19 & 0x3f);
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 100);
  uVar19 = 0x3e6;
  do {
    uVar19 = uVar19 + 2;
    uVar21 = uVar19 >> 6;
    if ((uVar21 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar21 + 1), _Var2)) {
      pbVar3->array[uVar21] = pbVar3->array[uVar21] | 1L << ((byte)uVar19 & 0x3e);
    }
  } while (uVar19 < 0x44a);
  uVar19 = pbVar3->arraysize;
  if (uVar19 != 0) {
    uVar15 = 0;
    uVar13 = 0;
    uVar21 = 0;
    do {
      uVar16 = pbVar3->array[uVar15] >> ((byte)uVar21 & 0x3f);
      if (uVar16 == 0) {
        lVar9 = uVar15 * -0x40;
        do {
          uVar15 = uVar15 + 1;
          if (uVar19 == uVar15) goto LAB_001027db;
          uVar21 = pbVar3->array[uVar15];
          lVar9 = lVar9 + -0x40;
        } while (uVar21 == 0);
        lVar18 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar21 = lVar18 - lVar9;
      }
      else {
        lVar9 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar21 = uVar21 + lVar9;
      }
      uVar15 = uVar13 * 2 + 800;
      if (uVar13 < 100) {
        uVar15 = uVar13;
      }
      if (uVar21 != uVar15) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar13 = uVar13 + 1;
      uVar21 = uVar21 + 1;
      uVar15 = uVar21 >> 6;
    } while (uVar15 < uVar19);
LAB_001027db:
    if (uVar13 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_construct() {
  bitset_t *b = bitset_create();
  for (int k = 0; k < 1000; ++k)
    bitset_set(b, 3 * k);
  TEST_ASSERT(bitset_count(b) == 1000);
  for (int k = 0; k < 3 * 1000; ++k)
    TEST_ASSERT(bitset_get(b, k) == (k / 3 * 3 == k));
  bitset_free(b);
}